

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedSSOSubroutine::Run(AdvancedSSOSubroutine *this)

{
  CallLogWrapper *pCVar1;
  GLuint GVar2;
  GLsizei width;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  GLint GVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined8 extraout_RAX;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  pointer pVVar20;
  long lVar21;
  char *pcVar22;
  uint uVar23;
  bool bVar24;
  allocator_type local_59;
  CallLogWrapper *local_58;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint indices [2];
  
  pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar2 = this->m_program;
  GVar13 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar2,"g_image0");
  glu::CallLogWrapper::glProgramUniform1i(pCVar1,GVar2,GVar13,1);
  GVar2 = this->m_program;
  GVar13 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar2,"g_image1");
  glu::CallLogWrapper::glProgramUniform1i(pCVar1,GVar2,GVar13,1);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2601);
  iVar14 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
             m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar14);
  iVar14 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
             m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glTexImage3D
            (pCVar1,0x8c1a,0,0x8814,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar14) + 4),3,0,
             0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0xc01,&this->m_draw_buffer);
  glu::CallLogWrapper::glDrawBuffer(pCVar1,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,1,this->m_texture,0,'\x01',0,0x88ba,0x8814);
  glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
  glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_attribless_vao);
  indices[0] = glu::CallLogWrapper::glGetSubroutineIndex(pCVar1,this->m_program,0x8b30,"Brush0");
  indices[1] = glu::CallLogWrapper::glGetSubroutineIndex(pCVar1,this->m_program,0x8b30,"Brush1");
  glu::CallLogWrapper::glUniformSubroutinesuiv(pCVar1,0x8b30,1,indices);
  glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(pCVar1,4,0,3,1,0);
  iVar14 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
             m_renderCtx->_vptr_RenderContext[4])();
  iVar14 = *(int *)CONCAT44(extraout_var_01,iVar14);
  iVar15 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
             m_renderCtx->_vptr_RenderContext[4])();
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,(long)(iVar14 * *(int *)(CONCAT44(extraout_var_02,iVar15) + 4) * 3),&local_59);
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
  iVar14 = 0;
  glu::CallLogWrapper::glGetTexImage
            (pCVar1,0x8c1a,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_58 = pCVar1;
  do {
    iVar15 = 0;
    while( true ) {
      iVar16 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context
                 )->m_renderCtx->_vptr_RenderContext[4])();
      pCVar1 = local_58;
      if (*(int *)(CONCAT44(extraout_var_03,iVar16) + 4) <= iVar15) break;
      iVar16 = 0;
      while( true ) {
        iVar17 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        if (*(int *)CONCAT44(extraout_var_04,iVar17) <= iVar16) break;
        iVar17 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar17 = *(int *)CONCAT44(extraout_var_05,iVar17);
        iVar18 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar18 = *(int *)(CONCAT44(extraout_var_06,iVar18) + 4);
        iVar19 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar17 = *(int *)CONCAT44(extraout_var_07,iVar19) * iVar15 + iVar16 +
                 iVar18 * iVar14 * iVar17;
        iVar18 = iVar17 * 0x10;
        pVVar20 = data.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar17;
        fVar9 = pVVar20->m_data[0];
        fVar10 = pVVar20->m_data[1];
        fVar11 = pVVar20->m_data[2];
        fVar12 = pVVar20->m_data[3];
        if (iVar14 == 2) {
          auVar5._4_4_ = -(uint)(fVar10 != 0.0);
          auVar5._0_4_ = -(uint)(fVar9 != 0.0);
          auVar5._8_4_ = -(uint)(fVar11 != 1.0);
          auVar5._12_4_ = -(uint)(fVar12 != 1.0);
          iVar17 = movmskps(iVar18,auVar5);
          if (iVar17 == 0) goto LAB_009ceded;
          pcVar22 = "Color is (%f %f %f %f) should be (0 0 1 1)\n";
LAB_009cef9e:
          lVar21 = -1;
          anon_unknown_0::Output
                    (pcVar22,SUB84((double)fVar9,0),(double)fVar10,(double)fVar11,(double)fVar12);
          goto LAB_009cefd1;
        }
        if (iVar14 == 1) {
          auVar4._4_4_ = -(uint)(fVar10 != 1.0);
          auVar4._0_4_ = -(uint)(fVar9 != 0.0);
          auVar4._8_4_ = -(uint)(fVar11 != 0.0);
          auVar4._12_4_ = -(uint)(fVar12 != 1.0);
          iVar17 = movmskps(iVar18,auVar4);
          if (iVar17 == 0) goto LAB_009ceded;
          pcVar22 = "Color is (%f %f %f %f) should be (0 1 0 1)\n";
          goto LAB_009cef9e;
        }
        if ((iVar14 == 0) &&
           (auVar3._4_4_ = -(uint)(fVar10 != 0.0), auVar3._0_4_ = -(uint)(fVar9 != 1.0),
           auVar3._8_4_ = -(uint)(fVar11 != 0.0), auVar3._12_4_ = -(uint)(fVar12 != 1.0),
           iVar17 = movmskps(iVar18,auVar3), iVar17 != 0)) {
          pcVar22 = "Color is (%f %f %f %f) should be (1 0 0 1)\n";
          goto LAB_009cef9e;
        }
LAB_009ceded:
        iVar16 = iVar16 + 1;
      }
      iVar15 = iVar15 + 1;
    }
    iVar14 = iVar14 + 1;
    if (iVar14 == 3) {
      glu::CallLogWrapper::glUniformSubroutinesuiv(local_58,0x8b30,1,indices + 1);
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(pCVar1,4,0,3,1,0);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      uVar23 = 0;
      pVVar20 = (pointer)0x1908;
      glu::CallLogWrapper::glGetTexImage
                (pCVar1,0x8c1a,0,0x1908,0x1406,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      local_58 = (CallLogWrapper *)
                 CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
      do {
        iVar14 = 0;
        while( true ) {
          iVar15 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                     m_context)->m_renderCtx->_vptr_RenderContext[4])();
          if (*(int *)(CONCAT44(extraout_var_08,iVar15) + 4) <= iVar14) break;
          iVar15 = 0;
          while( true ) {
            iVar16 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            if (*(int *)CONCAT44(extraout_var_09,iVar16) <= iVar15) break;
            iVar16 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar16 = *(int *)CONCAT44(extraout_var_10,iVar16);
            iVar17 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar17 = *(int *)(CONCAT44(extraout_var_11,iVar17) + 4);
            iVar18 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar16 = *(int *)CONCAT44(extraout_var_12,iVar18) * iVar14 + iVar15 +
                     iVar17 * uVar23 * iVar16;
            iVar17 = iVar16 * 0x10;
            pVVar20 = data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar16;
            fVar9 = pVVar20->m_data[0];
            fVar10 = pVVar20->m_data[1];
            fVar11 = pVVar20->m_data[2];
            fVar12 = pVVar20->m_data[3];
            if (uVar23 == 2) {
              auVar8._4_4_ = -(uint)(fVar10 != 0.0);
              auVar8._0_4_ = -(uint)(fVar9 != 1.0);
              auVar8._8_4_ = -(uint)(fVar11 != 0.0);
              auVar8._12_4_ = -(uint)(fVar12 != 1.0);
              iVar16 = movmskps(iVar17,auVar8);
              if (iVar16 == 0) goto LAB_009cef53;
              pcVar22 = "Color is (%f %f %f %f) should be (1 0 0 1)\n";
LAB_009cf013:
              anon_unknown_0::Output
                        (pcVar22,SUB84((double)fVar9,0),(double)fVar10,(double)fVar11,(double)fVar12
                        );
              uVar23 = (uint)local_58;
              goto LAB_009cf043;
            }
            if (uVar23 == 1) {
              auVar7._4_4_ = -(uint)(fVar10 != 0.0);
              auVar7._0_4_ = -(uint)(fVar9 != 0.0);
              auVar7._8_4_ = -(uint)(fVar11 != 1.0);
              auVar7._12_4_ = -(uint)(fVar12 != 1.0);
              iVar16 = movmskps(iVar17,auVar7);
              if (iVar16 == 0) goto LAB_009cef53;
              pcVar22 = "Color is (%f %f %f %f) should be (0 0 1 1)\n";
              goto LAB_009cf013;
            }
            if ((uVar23 == 0) &&
               (auVar6._4_4_ = -(uint)(fVar10 != 1.0), auVar6._0_4_ = -(uint)(fVar9 != 0.0),
               auVar6._8_4_ = -(uint)(fVar11 != 0.0), auVar6._12_4_ = -(uint)(fVar12 != 1.0),
               iVar16 = movmskps(iVar17,auVar6), iVar16 != 0)) {
              pcVar22 = "Color is (%f %f %f %f) should be (0 1 0 1)\n";
              goto LAB_009cf013;
            }
LAB_009cef53:
            iVar15 = iVar15 + 1;
            pVVar20 = data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          iVar14 = iVar14 + 1;
        }
        bVar24 = uVar23 < 2;
        uVar23 = uVar23 + 1;
        pVVar20 = (pointer)CONCAT71((int7)((ulong)pVVar20 >> 8),bVar24);
        local_58 = (CallLogWrapper *)CONCAT44(local_58._4_4_,(int)pVVar20);
      } while (uVar23 != 3);
      uVar23 = 0;
LAB_009cf043:
      lVar21 = -(ulong)(uVar23 & 1);
LAB_009cefd1:
      if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return lVar21;
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image0"), 1);
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image1"), 1);

		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 3, 0, GL_RGBA, GL_FLOAT,
					 NULL);

		glGetIntegerv(GL_DRAW_BUFFER, &m_draw_buffer);

		glDrawBuffer(GL_NONE);
		glBindImageTexture(1, m_texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_RGBA32F);
		glUseProgram(m_program);
		glBindVertexArray(m_attribless_vao);

		const GLuint indices[2] = { glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush0"),
									glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush1") };

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[0]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight() * 3);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[1]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}